

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_4::RgbaYca::decimateChromaHoriz(int n,Rgba *ycaIn,Rgba *ycaOut)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar1;
  float fVar2;
  int j;
  int i;
  int end;
  int begin;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 local_28;
  undefined4 local_24;
  
  local_28 = 0;
  for (local_24 = 0xd; local_24 < in_EDI + 0xd; local_24 = local_24 + 1) {
    if ((local_28 & 1) == 0) {
      fVar1 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      fVar2 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      fVar1 = fVar1 * 0.001064 + fVar2 * -0.003771;
      fVar2 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      in_stack_ffffffffffffff70 = fVar2 * 0.009801 + fVar1;
      fVar2 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      in_stack_ffffffffffffff74 = fVar2 * -0.021586 + in_stack_ffffffffffffff70;
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),fVar1);
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),fVar1);
    }
    *(undefined2 *)(in_RDX + 2 + (long)(int)local_28 * 8) =
         *(undefined2 *)(in_RSI + 2 + (long)local_24 * 8);
    *(undefined2 *)(in_RDX + 6 + (long)(int)local_28 * 8) =
         *(undefined2 *)(in_RSI + 6 + (long)local_24 * 8);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void
decimateChromaHoriz (int n, const Rgba ycaIn[/*n+N-1*/], Rgba ycaOut[/*n*/])
{
#ifdef DEBUG
    assert (ycaIn != ycaOut);
#endif

    int begin = N2;
    int end   = begin + n;

    for (int i = begin, j = 0; i < end; ++i, ++j)
    {
        if ((j & 1) == 0)
        {
            ycaOut[j].r =
                ycaIn[i - 13].r * 0.001064f + ycaIn[i - 11].r * -0.003771f +
                ycaIn[i - 9].r * 0.009801f + ycaIn[i - 7].r * -0.021586f +
                ycaIn[i - 5].r * 0.043978f + ycaIn[i - 3].r * -0.093067f +
                ycaIn[i - 1].r * 0.313659f + ycaIn[i].r * 0.499846f +
                ycaIn[i + 1].r * 0.313659f + ycaIn[i + 3].r * -0.093067f +
                ycaIn[i + 5].r * 0.043978f + ycaIn[i + 7].r * -0.021586f +
                ycaIn[i + 9].r * 0.009801f + ycaIn[i + 11].r * -0.003771f +
                ycaIn[i + 13].r * 0.001064f;

            ycaOut[j].b =
                ycaIn[i - 13].b * 0.001064f + ycaIn[i - 11].b * -0.003771f +
                ycaIn[i - 9].b * 0.009801f + ycaIn[i - 7].b * -0.021586f +
                ycaIn[i - 5].b * 0.043978f + ycaIn[i - 3].b * -0.093067f +
                ycaIn[i - 1].b * 0.313659f + ycaIn[i].b * 0.499846f +
                ycaIn[i + 1].b * 0.313659f + ycaIn[i + 3].b * -0.093067f +
                ycaIn[i + 5].b * 0.043978f + ycaIn[i + 7].b * -0.021586f +
                ycaIn[i + 9].b * 0.009801f + ycaIn[i + 11].b * -0.003771f +
                ycaIn[i + 13].b * 0.001064f;
        }

        ycaOut[j].g = ycaIn[i].g;
        ycaOut[j].a = ycaIn[i].a;
    }
}